

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_string_radix_sort.h
# Opt level: O3

void __thiscall
parallel_string_radix_sort::ParallelStringRadixSort<const_unsigned_char_*>::Sort8
          (ParallelStringRadixSort<const_unsigned_char_*> *this,size_t bgn,size_t end,size_t depth,
          bool flip)

{
  uint8_t *puVar1;
  long lVar2;
  uchar *puVar3;
  uchar **ppuVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  size_t e;
  uchar **ppuVar8;
  size_t bgn_00;
  long lVar9;
  size_t sVar10;
  undefined7 in_register_00000081;
  ulong depth_00;
  long lVar11;
  size_t cnt [256];
  long local_838 [257];
  
  memset(local_838,0,0x800);
  ppuVar8 = this->temp_;
  ppuVar4 = this->data_;
  if ((int)CONCAT71(in_register_00000081,flip) != 0) {
    ppuVar8 = this->data_;
    ppuVar4 = this->temp_;
  }
  puVar1 = this->letters8_;
  sVar7 = bgn;
  if (end != bgn) {
    do {
      puVar1[sVar7] = ppuVar4[sVar7][depth];
      sVar7 = sVar7 + 1;
    } while (end != sVar7);
    sVar7 = bgn;
    if (end != bgn) {
      do {
        local_838[puVar1[sVar7]] = local_838[puVar1[sVar7]] + 1;
        sVar7 = sVar7 + 1;
      } while (end != sVar7);
    }
  }
  lVar9 = 0;
  lVar11 = 0;
  do {
    lVar2 = local_838[lVar9];
    local_838[lVar9] = lVar11;
    lVar9 = lVar9 + 1;
    lVar11 = lVar2 + lVar11;
  } while (lVar9 != 0x100);
  sVar7 = bgn;
  if (end != bgn) {
    do {
      lVar11 = local_838[puVar1[sVar7]];
      local_838[puVar1[sVar7]] = lVar11 + 1;
      puVar3 = ppuVar8[bgn + lVar11];
      ppuVar8[bgn + lVar11] = ppuVar4[sVar7];
      ppuVar4[sVar7] = puVar3;
      sVar7 = sVar7 + 1;
    } while (end != sVar7);
  }
  if (!flip) {
    if (local_838[0] == 0) {
      local_838[0] = 0;
    }
    else {
      lVar11 = 0;
      do {
        puVar3 = ppuVar4[bgn + lVar11];
        ppuVar4[bgn + lVar11] = ppuVar8[bgn + lVar11];
        ppuVar8[bgn + lVar11] = puVar3;
        lVar11 = lVar11 + 1;
      } while (local_838[0] != lVar11);
    }
  }
  depth_00 = depth + 1;
  lVar11 = 1;
  do {
    lVar9 = local_838[lVar11];
    uVar5 = lVar9 - local_838[0];
    if (uVar5 != 0) {
      bgn_00 = local_838[0] + bgn;
      sVar7 = lVar9 + bgn;
      if ((depth_00 < 100) && (0x1e < uVar5)) {
        if (uVar5 < 0x10000) {
          Sort8(this,bgn_00,sVar7,depth_00,!flip);
        }
        else {
          Sort16(this,bgn_00,sVar7,depth_00,!flip);
        }
      }
      else {
        uVar6 = uVar5;
        sVar10 = bgn_00;
        if (bgn_00 < sVar7 && !flip) {
          do {
            ppuVar4 = this->temp_;
            puVar3 = this->data_[sVar10];
            this->data_[sVar10] = ppuVar4[sVar10];
            ppuVar4[sVar10] = puVar3;
            uVar6 = uVar6 - 1;
            sVar10 = sVar10 + 1;
          } while (uVar6 != 0);
        }
        if (1 < uVar5) {
          ppuVar4 = this->data_ + sVar7;
          ppuVar8 = this->data_ + bgn_00;
          uVar5 = (long)(sVar7 * 8 + bgn_00 * -8) >> 3;
          lVar2 = 0x3f;
          if (uVar5 != 0) {
            for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          std::
          __introsort_loop<unsigned_char_const**,long,__gnu_cxx::__ops::_Iter_comp_iter<parallel_string_radix_sort::internal::Compare<unsigned_char_const*>>>
                    (ppuVar8,ppuVar4,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<parallel_string_radix_sort::internal::Compare<const_unsigned_char_*>_>
                      )(int)depth_00);
          std::
          __final_insertion_sort<unsigned_char_const**,__gnu_cxx::__ops::_Iter_comp_iter<parallel_string_radix_sort::internal::Compare<unsigned_char_const*>>>
                    (ppuVar8,ppuVar4,(Compare<const_unsigned_char_*>)(int)depth_00);
        }
      }
    }
    lVar11 = lVar11 + 1;
    local_838[0] = lVar9;
  } while (lVar11 != 0x100);
  return;
}

Assistant:

void ParallelStringRadixSort<StringType>
::Sort8(size_t bgn, size_t end, size_t depth, bool flip) {
  // Here we do not use |new| or |malloc|. This is because:
  // 1. these may be heavy bottle-necks under multi-thread, and
  // 2. the size is sufficiently small for preventing stack overflow.
  size_t cnt[1 << 8] = {};

  StringType *src = (flip ? temp_ : data_) + bgn;
  StringType *dst = (flip ? data_ : temp_) + bgn;
  uint8_t *let = letters8_ + bgn;
  size_t n = end - bgn;

  for (size_t i = 0; i < n; ++i) {
    let[i] = src[i][depth];
  }

  for (size_t i = 0; i < n; ++i) {
    ++cnt[let[i]];
  }

  size_t s = 0;
  for (int i = 0; i < 1 << 8; ++i) {
    std::swap(cnt[i], s);
    s += cnt[i];
  }

  for (size_t i = 0; i < n; ++i) {
    std::swap(dst[cnt[let[i]]++], src[i]);
  }

  if (flip == false) {
    size_t b = 0, e = cnt[0];
    for (size_t j = b; j < e; ++j) {
      std::swap(src[j], dst[j]);
    }
  }

  for (size_t i = 1; i < 1 << 8; ++i) {
    if (cnt[i] - cnt[i - 1] >= 1) {
      Recurse(bgn + cnt[i - 1], bgn + cnt[i], depth + 1, !flip);
    }
  }
}